

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

EVsource old_EVcreate_submit_handle(CManager cm,EVstone stone,CMFormatList format_list)

{
  FMFieldList list;
  int iVar1;
  CMFormatList pCVar2;
  FMStructDescList data_format;
  EVsource p_Var3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)(uint)stone;
  uVar5 = 0;
  for (pCVar2 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar2->format_name != (char *)0x0));
      pCVar2 = pCVar2 + 1) {
    uVar5 = uVar5 + 1;
  }
  uVar7 = (ulong)uVar5;
  data_format = (FMStructDescList)INT_CMmalloc(uVar7 * 0x20 + 0x20);
  if (uVar5 != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&data_format->format_name + lVar4 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar4);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar4);
      *(FMFieldList *)((long)&data_format->field_list + lVar4 * 2) = list;
      iVar1 = struct_size_field_list(list,(int)uVar6);
      *(int *)((long)&data_format->struct_size + lVar4 * 2) = iVar1;
      *(undefined8 *)((long)&data_format->opt_info + lVar4 * 2) = 0;
      lVar4 = lVar4 + 0x10;
    } while (uVar7 << 4 != lVar4);
  }
  data_format[uVar7].format_name = (char *)0x0;
  data_format[uVar7].field_list = (FMFieldList)0x0;
  p_Var3 = EVcreate_submit_handle(cm,stone,data_format);
  return p_Var3;
}

Assistant:

extern EVsource
old_EVcreate_submit_handle(CManager cm, EVstone stone, CMFormatList format_list)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVcreate_submit_handle(cm, stone, structs);
}